

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::AssertionInstanceExpression::fromLookup
          (AssertionInstanceExpression *this,Symbol *symbol,InvocationExpressionSyntax *syntax,
          SourceRange range,ASTContext *parentContext)

{
  group_type_pointer pgVar1;
  char *pcVar2;
  ExpressionKind EVar3;
  undefined4 uVar4;
  SourceLocation this_00;
  ExpressionSyntax *arg_00;
  uint uVar5;
  undefined1 auVar6 [16];
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  Variant *pVVar7;
  undefined8 uVar8;
  AssertionInstanceDetails *pAVar9;
  SyntaxNode *pSVar10;
  bool bVar11;
  byte bVar12;
  uint uVar13;
  int iVar14;
  SourceLocation args;
  uint64_t uVar15;
  Diagnostic *pDVar16;
  InvalidAssertionExpr *args_2;
  SourceLocation SVar17;
  Diagnostic *pDVar18;
  AssertionExpr *args_2_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AssertionPortSymbol *pAVar19;
  ActualArg *result;
  ulong uVar20;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  size_t extraout_RDX;
  string_view *psVar21;
  long lVar22;
  SyntaxKind typeKind;
  DiagCode code;
  DiagCode code_00;
  AssertionInstanceDetails *pAVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  PropertySymbol *prop;
  ConstantValue *pCVar27;
  table_element_pointer ppVar28;
  basic_string_view<char,_std::char_traits<char>_> *pbVar29;
  SyntaxNode *this_01;
  uchar uVar30;
  uchar uVar33;
  uchar uVar34;
  byte bVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  char cVar36;
  char cVar38;
  char cVar39;
  byte bVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  byte bVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  byte bVar51;
  undefined1 auVar37 [16];
  SourceRange SVar52;
  SourceRange sourceRange_02;
  string_view sVar53;
  try_emplace_args_t local_4b9;
  AssertionPortSymbol *formal;
  PropertyExprSyntax *expr;
  ulong local_4a8;
  ConstantValue *local_4a0;
  SourceRange range_local;
  uint local_47c;
  Scope *symbolScope;
  ulong local_468;
  ulong local_460;
  SourceLocation local_458;
  ASTContext *argCtx;
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  AssertionInstanceDetails *local_418;
  _Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false> local_410;
  undefined8 local_408;
  char cStack_400;
  char cStack_3ff;
  char cStack_3fe;
  byte bStack_3fd;
  char cStack_3fc;
  char cStack_3fb;
  char cStack_3fa;
  byte bStack_3f9;
  undefined8 local_3f8;
  char cStack_3f0;
  char cStack_3ef;
  char cStack_3ee;
  byte bStack_3ed;
  char cStack_3ec;
  char cStack_3eb;
  char cStack_3ea;
  byte bStack_3e9;
  ASTContext context;
  ActualArg arg;
  anon_class_48_6_f5681a60 setDefault;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
  x;
  SmallVector<const_slang::ast::Symbol_*,_5UL> localVars;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> orderedArgs;
  AssertionInstanceDetails instance;
  SmallVector<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_4UL>
  actualArgs;
  NamedArgMap namedArgs;
  
  SVar17 = range.endLoc;
  range_local.endLoc = range.startLoc;
  this_00 = **(SourceLocation **)SVar17;
  range_local.startLoc = (SourceLocation)syntax;
  Compilation::noteReference((Compilation *)this_00,(Symbol *)this,false);
  EVar3 = (this->super_Expression).kind;
  if (EVar3 == 0x55) {
    args = *(SourceLocation *)((long)this_00 + 0x188);
  }
  else {
    if (EVar3 == 0x50) {
      typeKind = PropertyType;
    }
    else {
      typeKind = SequenceType;
    }
    args = (SourceLocation)Compilation::getType((Compilation *)this_00,typeKind);
  }
  pCVar27 = this[1].super_Expression.constant;
  arg_00 = this[1].super_Expression.syntax;
  symbolScope = (Scope *)&this->arguments;
  orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_ =
       (pointer)orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.firstElement;
  orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len = 0;
  orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.cap = 5;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::SmallMap(&namedArgs);
  if (((symbol == (Symbol *)0x0) || (symbol[1].location == (SourceLocation)0x0)) ||
     (bVar11 = Expression::collectArgs
                         ((ASTContext *)SVar17,(ArgumentListSyntax *)symbol[1].location,
                          &orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>,
                          &namedArgs), bVar11)) {
    context.assertionInstance = *(AssertionInstanceDetails **)((long)SVar17 + 0x30);
    context.scope.ptr = *(Scope **)SVar17;
    context._8_8_ = *(undefined8 *)((long)SVar17 + 8);
    context.flags.m_bits = ((bitmask<slang::ast::ASTFlags> *)((long)SVar17 + 0x10))->m_bits;
    context.instanceOrProc = *(Symbol **)((long)SVar17 + 0x18);
    context.firstTempVar = *(TempVarSymbol **)((long)SVar17 + 0x20);
    context.randomizeDetails = *(RandomizeDetails **)((long)SVar17 + 0x28);
    ASTContext::tryFillAssertionDetails(&context);
    AssertionInstanceDetails::AssertionInstanceDetails(&instance);
    instance.prevContext = &context;
    instance.instanceLoc = range_local.startLoc;
    EVar3 = (this->super_Expression).kind;
    pAVar9 = context.assertionInstance;
    while (pAVar23 = pAVar9, instance.symbol = (Symbol *)this,
          pAVar23 != (AssertionInstanceDetails *)0x0) {
      if ((AssertionInstanceExpression *)pAVar23->symbol == this) {
        if (EVar3 == 0x4f) {
          code_00.subsystem = Expressions;
          code_00.code = 0x90;
        }
        else {
          if (EVar3 != 0x55) {
            if (pAVar23->isRecursive != true) {
              instance.isRecursive = true;
              goto LAB_00442d22;
            }
            actualArgs.
            super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
            .data_ = (pointer)0x0;
            args_2 = BumpAllocator::emplace<slang::ast::InvalidAssertionExpr,decltype(nullptr)>
                               ((BumpAllocator *)this_00,(void **)&actualArgs);
            actualArgs.
            super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
            .data_ = (pointer)CONCAT71(actualArgs.
                                       super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
                                       .data_._1_7_,1);
            SVar17 = (SourceLocation)
                     BumpAllocator::
                     emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::InvalidAssertionExpr&,bool,slang::SourceRange&>
                               ((BumpAllocator *)this_00,(Type *)args,(Symbol *)this,args_2,
                                (bool *)&actualArgs,&range_local);
            goto LAB_00443893;
          }
          code_00.subsystem = Expressions;
          code_00.code = 0x8c;
        }
        SVar52.endLoc = range_local.endLoc;
        SVar52.startLoc = range_local.startLoc;
        pDVar16 = ASTContext::addDiag(&context,code_00,SVar52);
        sVar53._M_len = *(size_t *)&(this->super_Expression).type;
        sVar53._M_str = (char *)(this->super_Expression).constant;
        Diagnostic::operator<<(pDVar16,sVar53);
        args = (SourceLocation)0x0;
        SVar17 = (SourceLocation)Expression::badExpr((Compilation *)this_00,(Expression *)0x0);
        goto LAB_00443893;
      }
LAB_00442d22:
      pAVar9 = pAVar23->argDetails;
      if (pAVar23->argDetails == (AssertionInstanceDetails *)0x0) {
        pAVar9 = pAVar23->prevContext->assertionInstance;
      }
    }
    actualArgs.
    super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
    .data_ = (pointer)actualArgs.
                      super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
                      .firstElement;
    actualArgs.
    super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
    .len = 0;
    actualArgs.
    super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
    .cap = 4;
    pVVar7 = &pCVar27->value;
    local_458 = (SourceLocation)0x0;
    local_47c = 0;
    local_4a8 = 0;
    for (; uVar20 = (ulong)local_47c,
        pCVar27 !=
        (ConstantValue *)
        ((long)&(pVVar7->
                super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ).
                super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        + (long)arg_00 * 8);
        pCVar27 = (ConstantValue *)
                  ((long)&(pCVar27->value).
                          super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  + 8)) {
      formal = *(AssertionPortSymbol **)
                &(pCVar27->value).
                 super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ;
      argCtx = &context;
      expr = (PropertyExprSyntax *)0x0;
      localVars.stackBase[0x18] = '\0';
      setDefault.expr = &expr;
      setDefault.formal = &formal;
      setDefault.defValCtx = (optional<slang::ast::ASTContext> *)&localVars;
      setDefault.symbolScope = &symbolScope;
      setDefault.instance = &instance;
      setDefault.argCtx = &argCtx;
      local_4a0 = pCVar27;
      if (uVar20 < orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len) {
        this_01 = orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_[uVar20]
        ;
        pSVar10 = this_01;
        if (((this_01->kind == EmptyArgument) &&
            (fromLookup::anon_class_48_6_f5681a60::operator()(&setDefault),
            pSVar10 = &expr->super_SyntaxNode, expr == (PropertyExprSyntax *)0x0)) &&
           ((formal->super_Symbol).name._M_len != 0)) {
          SVar52 = slang::syntax::SyntaxNode::sourceRange(this_01);
          pDVar16 = ASTContext::addDiag(&context,(DiagCode)0x7,SVar52);
          Diagnostic::operator<<(pDVar16,(formal->super_Symbol).name);
          pSVar10 = &expr->super_SyntaxNode;
        }
        expr = (PropertyExprSyntax *)pSVar10;
        local_47c = local_47c + 1;
        psVar21 = &(formal->super_Symbol).name;
        uVar15 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &namedArgs.super_Storage.field_0x108,psVar21);
        uVar24 = uVar15 >> (namedArgs._272_1_ & 0x3f);
        lVar22 = (uVar15 & 0xff) * 4;
        cVar36 = (&UNK_004a00ac)[lVar22];
        cVar38 = (&UNK_004a00ad)[lVar22];
        cVar39 = (&UNK_004a00ae)[lVar22];
        bVar40 = (&UNK_004a00af)[lVar22];
        uVar20 = 0;
        cVar41 = cVar36;
        cVar42 = cVar38;
        cVar43 = cVar39;
        bVar35 = bVar40;
        cVar44 = cVar36;
        cVar45 = cVar38;
        cVar46 = cVar39;
        bVar47 = bVar40;
        cVar48 = cVar36;
        cVar49 = cVar38;
        cVar50 = cVar39;
        bVar51 = bVar40;
        do {
          uVar8 = namedArgs._296_8_;
          pcVar2 = (char *)(namedArgs._288_8_ + uVar24 * 0x10);
          bVar12 = pcVar2[0xf];
          auVar32[0] = -(*pcVar2 == cVar36);
          auVar32[1] = -(pcVar2[1] == cVar38);
          auVar32[2] = -(pcVar2[2] == cVar39);
          auVar32[3] = -(pcVar2[3] == bVar40);
          auVar32[4] = -(pcVar2[4] == cVar41);
          auVar32[5] = -(pcVar2[5] == cVar42);
          auVar32[6] = -(pcVar2[6] == cVar43);
          auVar32[7] = -(pcVar2[7] == bVar35);
          auVar32[8] = -(pcVar2[8] == cVar44);
          auVar32[9] = -(pcVar2[9] == cVar45);
          auVar32[10] = -(pcVar2[10] == cVar46);
          auVar32[0xb] = -(pcVar2[0xb] == bVar47);
          auVar32[0xc] = -(pcVar2[0xc] == cVar48);
          auVar32[0xd] = -(pcVar2[0xd] == cVar49);
          auVar32[0xe] = -(pcVar2[0xe] == cVar50);
          auVar32[0xf] = -(bVar12 == bVar51);
          uVar13 = (uint)(ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe);
          if (uVar13 != 0) {
            local_3f8 = CONCAT17(bVar35,CONCAT16(cVar43,CONCAT15(cVar42,CONCAT14(cVar41,CONCAT13(
                                                  bVar40,CONCAT12(cVar39,CONCAT11(cVar38,cVar36)))))
                                                ));
            lVar22 = namedArgs._288_8_ + uVar24 * 0x10;
            pAVar19 = (AssertionPortSymbol *)(uVar24 * 0x1e0);
            local_468 = uVar24;
            local_460 = uVar20;
            local_408 = this_01;
            cStack_3f0 = cVar44;
            cStack_3ef = cVar45;
            cStack_3ee = cVar46;
            bStack_3ed = bVar47;
            cStack_3ec = cVar48;
            cStack_3eb = cVar49;
            cStack_3ea = cVar50;
            bStack_3e9 = bVar51;
            do {
              iVar14 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
                }
              }
              pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)
                        ((long)&(((AssertionPortSymbol *)(uVar24 * 0x1e0))->super_Symbol).kind +
                        (ulong)(uint)(iVar14 << 5) + uVar8);
              bVar11 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)&namedArgs.super_Storage.field_0x108,psVar21,pbVar29);
              if (bVar11) {
                SVar17 = parsing::Token::location((Token *)(pbVar29[1]._M_len + 0x28));
                pDVar16 = ASTContext::addDiag(&context,(DiagCode)0x4a0007,SVar17);
                Diagnostic::operator<<(pDVar16,(formal->super_Symbol).name);
                local_448 = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(local_408);
                pCVar27 = local_4a0;
                SVar17 = parsing::Token::location((Token *)local_448);
                pDVar16 = Diagnostic::addNote(pDVar16,(DiagCode)0xc0001,SVar17);
                *(undefined1 *)&pbVar29[1]._M_str = 1;
                local_4a8 = CONCAT71((int7)((ulong)pDVar16 >> 8),1);
                goto LAB_0044327e;
              }
              uVar13 = uVar13 - 1 & uVar13;
            } while (uVar13 != 0);
            bVar12 = *(byte *)(lVar22 + 0xf);
            uVar20 = local_460;
            uVar24 = local_468;
            pCVar27 = local_4a0;
            this_01 = local_408;
            cVar36 = (char)local_3f8;
            cVar38 = local_3f8._1_1_;
            cVar39 = local_3f8._2_1_;
            bVar40 = local_3f8._3_1_;
            cVar41 = local_3f8._4_1_;
            cVar42 = local_3f8._5_1_;
            cVar43 = local_3f8._6_1_;
            bVar35 = local_3f8._7_1_;
            cVar44 = cStack_3f0;
            cVar45 = cStack_3ef;
            cVar46 = cStack_3ee;
            bVar47 = bStack_3ed;
            cVar48 = cStack_3ec;
            cVar49 = cStack_3eb;
            cVar50 = cStack_3ea;
            bVar51 = bStack_3e9;
          }
          pAVar19 = (AssertionPortSymbol *)
                    &boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift;
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7] & bVar12) == 0) break;
          lVar22 = uVar24 + uVar20;
          uVar20 = uVar20 + 1;
          uVar24 = lVar22 + 1U & namedArgs._280_8_;
        } while (uVar20 <= (ulong)namedArgs._280_8_);
LAB_0044327e:
        if (expr != (PropertyExprSyntax *)0x0) goto LAB_0044328c;
        uVar20 = CONCAT71((int7)((ulong)pAVar19 >> 8),1);
      }
      else {
        psVar21 = &(formal->super_Symbol).name;
        uVar15 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &namedArgs.super_Storage.field_0x108,psVar21);
        uVar25 = uVar15 >> (namedArgs._272_1_ & 0x3f);
        lVar22 = (uVar15 & 0xff) * 4;
        cVar36 = (&UNK_004a00ac)[lVar22];
        cVar38 = (&UNK_004a00ad)[lVar22];
        cVar39 = (&UNK_004a00ae)[lVar22];
        bVar40 = (&UNK_004a00af)[lVar22];
        uVar24 = 0;
        cVar41 = cVar36;
        cVar42 = cVar38;
        cVar43 = cVar39;
        bVar35 = bVar40;
        cVar44 = cVar36;
        cVar45 = cVar38;
        cVar46 = cVar39;
        bVar47 = bVar40;
        cVar48 = cVar36;
        cVar49 = cVar38;
        cVar50 = cVar39;
        bVar51 = bVar40;
        do {
          uVar8 = namedArgs._296_8_;
          pcVar2 = (char *)(namedArgs._288_8_ + uVar25 * 0x10);
          bVar12 = pcVar2[0xf];
          auVar31[0] = -(*pcVar2 == cVar36);
          auVar31[1] = -(pcVar2[1] == cVar38);
          auVar31[2] = -(pcVar2[2] == cVar39);
          auVar31[3] = -(pcVar2[3] == bVar40);
          auVar31[4] = -(pcVar2[4] == cVar41);
          auVar31[5] = -(pcVar2[5] == cVar42);
          auVar31[6] = -(pcVar2[6] == cVar43);
          auVar31[7] = -(pcVar2[7] == bVar35);
          auVar31[8] = -(pcVar2[8] == cVar44);
          auVar31[9] = -(pcVar2[9] == cVar45);
          auVar31[10] = -(pcVar2[10] == cVar46);
          auVar31[0xb] = -(pcVar2[0xb] == bVar47);
          auVar31[0xc] = -(pcVar2[0xc] == cVar48);
          auVar31[0xd] = -(pcVar2[0xd] == cVar49);
          auVar31[0xe] = -(pcVar2[0xe] == cVar50);
          auVar31[0xf] = -(bVar12 == bVar51);
          uVar13 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe);
          if (uVar13 != 0) {
            local_408 = (SyntaxNode *)
                        CONCAT17(bVar35,CONCAT16(cVar43,CONCAT15(cVar42,CONCAT14(cVar41,CONCAT13(
                                                  bVar40,CONCAT12(cVar39,CONCAT11(cVar38,cVar36)))))
                                                ));
            lVar22 = namedArgs._288_8_ + uVar25 * 0x10;
            pAVar19 = (AssertionPortSymbol *)(uVar25 * 0x1e0);
            local_468 = uVar20;
            local_460 = uVar25;
            cStack_400 = cVar44;
            cStack_3ff = cVar45;
            cStack_3fe = cVar46;
            bStack_3fd = bVar47;
            cStack_3fc = cVar48;
            cStack_3fb = cVar49;
            cStack_3fa = cVar50;
            bStack_3f9 = bVar51;
            local_3f8 = uVar24;
            do {
              iVar14 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
                }
              }
              pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)
                        ((long)&(((AssertionPortSymbol *)(uVar25 * 0x1e0))->super_Symbol).kind +
                        (ulong)(uint)(iVar14 << 5) + uVar8);
              bVar11 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)&namedArgs.super_Storage.field_0x108,psVar21,pbVar29);
              if (bVar11) {
                *(undefined1 *)&pbVar29[1]._M_str = 1;
                expr = *(PropertyExprSyntax **)(pbVar29[1]._M_len + 0x48);
                if ((expr != (PropertyExprSyntax *)0x0) ||
                   (fromLookup::anon_class_48_6_f5681a60::operator()(&setDefault),
                   pCVar27 = local_4a0, expr != (PropertyExprSyntax *)0x0)) goto LAB_0044328c;
                if ((formal->super_Symbol).name._M_len == 0) goto LAB_0044327e;
                sourceRange_02 =
                     slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pbVar29[1]._M_len);
                code.subsystem = Expressions;
                code.code = 0;
                goto LAB_0044308c;
              }
              uVar13 = uVar13 - 1 & uVar13;
            } while (uVar13 != 0);
            bVar12 = *(byte *)(lVar22 + 0xf);
            uVar24 = local_3f8;
            uVar25 = local_460;
            uVar20 = local_468;
            cVar36 = (char)local_408;
            cVar38 = local_408._1_1_;
            cVar39 = local_408._2_1_;
            bVar40 = local_408._3_1_;
            cVar41 = local_408._4_1_;
            cVar42 = local_408._5_1_;
            cVar43 = local_408._6_1_;
            bVar35 = local_408._7_1_;
            cVar44 = cStack_400;
            cVar45 = cStack_3ff;
            cVar46 = cStack_3fe;
            bVar47 = bStack_3fd;
            cVar48 = cStack_3fc;
            cVar49 = cStack_3fb;
            cVar50 = cStack_3fa;
            bVar51 = bStack_3f9;
          }
          pAVar19 = (AssertionPortSymbol *)
                    &boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift;
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7] & bVar12) == 0) break;
          lVar22 = uVar25 + uVar24;
          uVar24 = uVar24 + 1;
          uVar25 = lVar22 + 1U & namedArgs._280_8_;
        } while (uVar24 <= (ulong)namedArgs._280_8_);
        fromLookup::anon_class_48_6_f5681a60::operator()(&setDefault);
        if (expr == (PropertyExprSyntax *)0x0) {
          if (namedArgs._312_8_ != 0) {
            pCVar27 = local_4a0;
            if ((formal->super_Symbol).name._M_len != 0) {
              sourceRange_02.endLoc = range_local.endLoc;
              sourceRange_02.startLoc = range_local.startLoc;
              code.subsystem = Expressions;
              code.code = 0xa2;
LAB_0044308c:
              pDVar16 = ASTContext::addDiag(&context,code,sourceRange_02);
              pAVar19 = formal;
              Diagnostic::operator<<(pDVar16,(formal->super_Symbol).name);
            }
            goto LAB_0044327e;
          }
          sourceRange.endLoc = range_local.endLoc;
          sourceRange.startLoc = range_local.startLoc;
          pDVar16 = ASTContext::addDiag(&context,(DiagCode)0x9f0007,sourceRange);
          arg_01._M_len = *(size_t *)&(this->super_Expression).type;
          arg_01._M_str = (char *)(this->super_Expression).constant;
          Diagnostic::operator<<(pDVar16,arg_01);
          pDVar16 = Diagnostic::operator<<<unsigned_long>(pDVar16,(unsigned_long)arg_00);
          pDVar16 = Diagnostic::operator<<<unsigned_long>
                              (pDVar16,orderedArgs.
                                       super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len)
          ;
          local_4a8 = CONCAT71((int7)((ulong)pDVar16 >> 8),1);
          break;
        }
LAB_0044328c:
        local_448 = *(undefined1 (*) [16])argCtx;
        local_438._0_8_ = argCtx->flags;
        local_438._8_8_ = argCtx->instanceOrProc;
        local_428._0_8_ = argCtx->firstTempVar;
        local_428._8_8_ = argCtx->randomizeDetails;
        local_418 = argCtx->assertionInstance;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = formal;
        uVar25 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar24 = uVar25 >> ((byte)instance.argumentMap.table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                  .arrays.groups_size_index & 0x3f);
        x.val.storage.t_ = &formal->super_Symbol;
        uVar4 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar25 & 0xff];
        uVar26 = 0;
        uVar20 = uVar24;
        do {
          pgVar1 = instance.argumentMap.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   .arrays.groups_ + uVar20;
          bVar40 = pgVar1->m[0xf].n;
          uVar30 = (uchar)uVar4;
          auVar37[0] = -(pgVar1->m[0].n == uVar30);
          uVar33 = (uchar)((uint)uVar4 >> 8);
          auVar37[1] = -(pgVar1->m[1].n == uVar33);
          uVar34 = (uchar)((uint)uVar4 >> 0x10);
          auVar37[2] = -(pgVar1->m[2].n == uVar34);
          bVar35 = (byte)((uint)uVar4 >> 0x18);
          auVar37[3] = -(pgVar1->m[3].n == bVar35);
          auVar37[4] = -(pgVar1->m[4].n == uVar30);
          auVar37[5] = -(pgVar1->m[5].n == uVar33);
          auVar37[6] = -(pgVar1->m[6].n == uVar34);
          auVar37[7] = -(pgVar1->m[7].n == bVar35);
          auVar37[8] = -(pgVar1->m[8].n == uVar30);
          auVar37[9] = -(pgVar1->m[9].n == uVar33);
          auVar37[10] = -(pgVar1->m[10].n == uVar34);
          auVar37[0xb] = -(pgVar1->m[0xb].n == bVar35);
          auVar37[0xc] = -(pgVar1->m[0xc].n == uVar30);
          auVar37[0xd] = -(pgVar1->m[0xd].n == uVar33);
          auVar37[0xe] = -(pgVar1->m[0xe].n == uVar34);
          auVar37[0xf] = -(bVar40 == bVar35);
          for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe);
              local_410._M_head_impl = expr, uVar13 != 0; uVar13 = uVar13 - 1 & uVar13) {
            uVar5 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            if (formal == (AssertionPortSymbol *)
                          instance.argumentMap.table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                          .arrays.elements_[uVar20 * 0xf + (ulong)uVar5].first) goto LAB_004433fa;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar25 & 7] & bVar40) == 0) break;
          lVar22 = uVar20 + uVar26;
          uVar26 = uVar26 + 1;
          uVar20 = lVar22 + 1U &
                   instance.argumentMap.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   .arrays.groups_size_mask;
        } while (uVar26 <= instance.argumentMap.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                           .arrays.groups_size_mask);
        if (instance.argumentMap.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
            .size_ctrl.size <
            instance.argumentMap.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                    ((locator *)&arg,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                      *)&instance.argumentMap,uVar24,uVar25,&local_4b9,(Symbol **)&x,
                     (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                     local_448);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                    ((locator *)&arg,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                      *)&instance.argumentMap,uVar25,&local_4b9,(Symbol **)&x,
                     (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                     local_448);
        }
LAB_004433fa:
        pCVar27 = local_4a0;
        arg.
        super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
        .
        super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
        .
        super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
        .
        super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
        .
        super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
        .
        super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
        ._M_u = (_Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                 )0x0;
        arg.
        super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
        .
        super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
        .
        super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
        .
        super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
        .
        super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
        .
        super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
        ._M_index = '\0';
        result = &arg;
        bVar11 = checkAssertionArg(expr,formal,argCtx,result,instance.isRecursive);
        uVar20 = CONCAT71((int7)((ulong)result >> 8),1);
        if (bVar11) {
          local_448._9_7_ =
               arg.
               super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               .
               super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               .
               super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               .
               super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               .
               super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               .
               super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               ._9_7_;
          local_448[8] = arg.
                         super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                         .
                         super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                         .
                         super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                         .
                         super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                         .
                         super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                         .
                         super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                         ._M_index;
          local_448._0_8_ =
               arg.
               super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               .
               super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               .
               super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               .
               super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               .
               super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               .
               super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               ._M_u;
          local_438._0_8_ = formal;
          SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
          ::
          emplace_back<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
                    ((SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
                      *)&actualArgs,
                     (tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                      *)local_448);
          uVar20 = local_4a8 & 0xffffffff;
        }
        if (((((ulong)local_458 & 0xfffffff) == 0) &&
            ((formal->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>.
             _M_payload.super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged ==
             true)) &&
           ((formal->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::ArgumentDirection>._M_payload.
            _M_value - Out < 2)) {
          local_458 = (formal->super_Symbol).location;
        }
      }
      local_4a8 = uVar20 & 0xffffffff;
    }
    if (uVar20 < orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len) {
      sourceRange_00.endLoc = range_local.endLoc;
      sourceRange_00.startLoc = range_local.startLoc;
      pDVar16 = ASTContext::addDiag(&context,(DiagCode)0xa00007,sourceRange_00);
      arg_02._M_len = *(size_t *)&(this->super_Expression).type;
      arg_02._M_str = (char *)(this->super_Expression).constant;
      Diagnostic::operator<<(pDVar16,arg_02);
      pDVar18 = Diagnostic::operator<<<unsigned_long>(pDVar16,(unsigned_long)arg_00);
      local_4a8 = CONCAT71((int7)((ulong)pDVar18 >> 8),1);
      Diagnostic::operator<<<unsigned_long>
                (pDVar16,orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len);
    }
    localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>._0_16_ =
         boost::unordered::detail::foa::
         table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
         ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                  *)&namedArgs.super_Storage.field_0x108);
    ppVar28 = localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len;
    while (ppVar28 != (table_element_pointer)0x0) {
      if ((ppVar28->second).second == false) {
        SVar17 = parsing::Token::location(&((ppVar28->second).first)->name);
        pDVar16 = ASTContext::addDiag(&context,(DiagCode)0x10007,SVar17);
        sVar53 = parsing::Token::valueText(&((ppVar28->second).first)->name);
        Diagnostic::operator<<(pDVar16,sVar53);
        arg_03._M_len = *(size_t *)&(this->super_Expression).type;
        arg_03._M_str = (char *)(this->super_Expression).constant;
        local_4a8 = CONCAT71((int7)((ulong)this >> 8),1);
        Diagnostic::operator<<(pDVar16,arg_03);
      }
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                   *)&localVars);
      ppVar28 = (table_element_pointer)
                localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len;
    }
    local_448._8_4_ = 0xffffffff;
    local_448._0_8_ = symbolScope;
    local_438 = (undefined1  [16])0x0;
    local_428 = (undefined1  [16])0x0;
    local_418 = &instance;
    if ((context.flags.m_bits & 0x600000) != 0) {
      local_438._0_8_ = context.flags.m_bits & 0x400000 | 0x200000;
      if (((uint)context.flags.m_bits >> 0x15 & 1) == 0) {
        local_438._0_8_ = 0x400000;
      }
      local_438._8_8_ = 0;
    }
    if ((this->super_Expression).kind == 0x55) {
      args = this[1].super_Expression.sourceRange.startLoc;
      SVar17 = (SourceLocation)
               Expression::create((Compilation *)this_00,(ExpressionSyntax *)args,
                                  (ASTContext *)local_448,(bitmask<slang::ast::ASTFlags>)0x0,
                                  (Type *)0x0);
    }
    else {
      localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len = 0;
      localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ =
           (pointer)localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement;
      localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = 5;
      args_2_00 = bindAssertionBody((Symbol *)this,(SyntaxNode *)this->body,(ASTContext *)local_448,
                                    local_458,&instance,
                                    &localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>);
      setDefault.expr = (PropertyExprSyntax **)((ulong)setDefault.expr & 0xffffffffffffff00);
      SVar17 = (SourceLocation)
               BumpAllocator::
               emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
                         ((BumpAllocator *)this_00,(Type *)args,(Symbol *)this,args_2_00,
                          (bool *)&setDefault,&range_local);
      iVar14 = SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
               ::copy(&actualArgs.
                       super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
                      ,(EVP_PKEY_CTX *)this_00,src);
      *(ulong *)((long)SVar17 + 0x40) = CONCAT44(extraout_var,iVar14);
      *(EVP_PKEY_CTX **)((long)SVar17 + 0x48) = src_00;
      args = this_00;
      iVar14 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                         (&localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>,
                          (EVP_PKEY_CTX *)this_00,src_00);
      *(ulong *)((long)SVar17 + 0x50) = CONCAT44(extraout_var_00,iVar14);
      (((flat_hash_set<std::string_view> *)((long)SVar17 + 0x58))->table_).
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
      .arrays.groups_size_index = extraout_RDX;
      if (instance.isRecursive == true) {
        args = (SourceLocation)0x8f0007;
        if ((((uint)context.flags.m_bits >> 0x16 & 1) == 0) ||
           (args = (SourceLocation)0x8e0007, ((uint)context.flags.m_bits >> 0x15 & 1) != 0)) {
          sourceRange_01.endLoc = range_local.endLoc;
          sourceRange_01.startLoc = range_local.startLoc;
          ASTContext::addDiag(&context,args._0_4_,sourceRange_01);
        }
      }
      if ((local_4a8 & 1) != 0 || args_2_00->kind == Invalid) {
        args = SVar17;
        SVar17 = (SourceLocation)Expression::badExpr((Compilation *)this_00,(Expression *)SVar17);
      }
      SmallVectorBase<const_slang::ast::Symbol_*>::cleanup
                (&localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>,(EVP_PKEY_CTX *)args);
    }
    SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
    ::cleanup(&actualArgs.
               super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
              ,(EVP_PKEY_CTX *)args);
LAB_00443893:
    AssertionInstanceDetails::~AssertionInstanceDetails(&instance);
  }
  else {
    args = (SourceLocation)0x0;
    SVar17 = (SourceLocation)Expression::badExpr((Compilation *)this_00,(Expression *)0x0);
  }
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                 *)&namedArgs.super_Storage.field_0x108);
  SmallVectorBase<const_slang::syntax::SyntaxNode_*>::cleanup
            (&orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>,
             (EVP_PKEY_CTX *)args);
  return (Expression *)SVar17;
}

Assistant:

Expression& AssertionInstanceExpression::fromLookup(const Symbol& symbol,
                                                    const InvocationExpressionSyntax* syntax,
                                                    SourceRange range,
                                                    const ASTContext& parentContext) {
    auto& comp = parentContext.getCompilation();
    const Type* type;
    const Scope* symbolScope;
    std::span<const AssertionPortSymbol* const> formalPorts;

    comp.noteReference(symbol);
    switch (symbol.kind) {
        case SymbolKind::Sequence: {
            auto& seq = symbol.as<SequenceSymbol>();
            type = &comp.getType(SyntaxKind::SequenceType);
            formalPorts = seq.ports;
            symbolScope = &seq;
            break;
        }
        case SymbolKind::Property: {
            auto& prop = symbol.as<PropertySymbol>();
            type = &comp.getType(SyntaxKind::PropertyType);
            formalPorts = prop.ports;
            symbolScope = &prop;
            break;
        }
        case SymbolKind::LetDecl: {
            auto& let = symbol.as<LetDeclSymbol>();
            type = &comp.getVoidType();
            formalPorts = let.ports;
            symbolScope = &let;
            break;
        }
        default:
            SLANG_UNREACHABLE;
    }

    SmallVector<const SyntaxNode*> orderedArgs;
    NamedArgMap namedArgs;
    if (syntax && syntax->arguments) {
        if (!collectArgs(parentContext, *syntax->arguments, orderedArgs, namedArgs))
            return badExpr(comp, nullptr);
    }

    ASTContext context = parentContext;
    context.tryFillAssertionDetails();

    AssertionInstanceDetails instance;
    instance.symbol = &symbol;
    instance.prevContext = &context;
    instance.instanceLoc = range.start();

    // Check for recursive instantiation. This is illegal for sequences, and allowed in
    // some forms for properties.
    auto currInst = context.assertionInstance;
    while (currInst) {
        if (currInst->symbol == &symbol) {
            if (symbol.kind == SymbolKind::Sequence) {
                context.addDiag(diag::RecursiveSequence, range) << symbol.name;
                return badExpr(comp, nullptr);
            }
            else if (symbol.kind == SymbolKind::LetDecl) {
                context.addDiag(diag::RecursiveLet, range) << symbol.name;
                return badExpr(comp, nullptr);
            }

            // Properties are allowed to be recursive, but we should avoid trying
            // to expand them because that will continue forever. Instead, we want
            // to expand one time for each unique invocation of the property and when
            // we encounter it again we should mark a placeholder and return to stop
            // the recursion.
            if (currInst->isRecursive) {
                auto& body = *comp.emplace<InvalidAssertionExpr>(nullptr);
                return *comp.emplace<AssertionInstanceExpression>(*type, symbol, body,
                                                                  /* isRecursiveProperty */ true,
                                                                  range);
            }
            instance.isRecursive = true;
        }

        if (currInst->argDetails)
            currInst = currInst->argDetails;
        else {
            SLANG_ASSERT(currInst->prevContext);
            currInst = currInst->prevContext->assertionInstance;
        }
    }

    // Now map all arguments to their formal ports.
    bool bad = false;
    uint32_t orderedIndex = 0;
    SourceLocation outputLocalVarArgLoc;
    SmallVector<std::tuple<const Symbol*, ActualArg>, 4> actualArgs;

    for (auto formal : formalPorts) {
        const ASTContext* argCtx = &context;
        const PropertyExprSyntax* expr = nullptr;
        std::optional<ASTContext> defValCtx;

        auto setDefault = [&] {
            expr = formal->defaultValueSyntax;
            defValCtx.emplace(*symbolScope, LookupLocation::after(*formal));
            defValCtx->assertionInstance = &instance;
            defValCtx->flags |= ASTFlags::AssertionDefaultArg;
            argCtx = &defValCtx.value();
        };

        if (orderedIndex < orderedArgs.size()) {
            auto arg = orderedArgs[orderedIndex++];
            if (arg->kind == SyntaxKind::EmptyArgument) {
                // Empty arguments are allowed as long as a default is provided.
                setDefault();
                if (!expr && !formal->name.empty())
                    context.addDiag(diag::ArgCannotBeEmpty, arg->sourceRange()) << formal->name;
            }
            else {
                expr = &arg->as<PropertyExprSyntax>();
            }

            // Make sure there isn't also a named value for this argument.
            if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
                auto& diag = context.addDiag(diag::DuplicateArgAssignment,
                                             it->second.first->name.location());
                diag << formal->name;
                diag.addNote(diag::NotePreviousUsage, arg->getFirstToken().location());
                it->second.second = true;
                bad = true;
            }
        }
        else if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
            // Mark this argument as used so that we can later detect if
            // any were unused.
            it->second.second = true;

            expr = it->second.first->expr;
            if (!expr) {
                // Empty arguments are allowed as long as a default is provided.
                setDefault();
                if (!expr && !formal->name.empty()) {
                    context.addDiag(diag::ArgCannotBeEmpty, it->second.first->sourceRange())
                        << formal->name;
                }
            }
        }
        else {
            setDefault();
            if (!expr) {
                if (namedArgs.empty()) {
                    auto& diag = context.addDiag(diag::TooFewArguments, range);
                    diag << symbol.name;
                    diag << formalPorts.size() << orderedArgs.size();
                    bad = true;
                    break;
                }
                else if (!formal->name.empty()) {
                    context.addDiag(diag::UnconnectedArg, range) << formal->name;
                }
            }
        }

        if (!expr) {
            bad = true;
            continue;
        }

        // Map the expression to the port symbol; this will be looked up later
        // when we encounter uses in the sequence / property body.
        instance.argumentMap.emplace(formal, std::make_tuple(expr, *argCtx));

        // Do type checking for all arguments now, even though the actuals will remain as
        // syntax nodes and be rebound when we actually encounter uses of them in the body.
        // This is because the arguments might not actually be used anywhere in the body,
        // so the only place to detect mismatches is here, but we can't save the bound
        // form because assertion item arguments are replaced as-is for each usage.
        ActualArg arg;
        if (!checkAssertionArg(*expr, *formal, *argCtx, arg, instance.isRecursive))
            bad = true;
        else
            actualArgs.push_back({formal, arg});

        if (!outputLocalVarArgLoc && (formal->direction == ArgumentDirection::InOut ||
                                      formal->direction == ArgumentDirection::Out)) {
            outputLocalVarArgLoc = formal->location;
        }
    }

    // Make sure there weren't too many ordered arguments provided.
    if (orderedIndex < orderedArgs.size()) {
        auto& diag = context.addDiag(diag::TooManyArguments, range);
        diag << symbol.name;
        diag << formalPorts.size();
        diag << orderedArgs.size();
        bad = true;
    }

    for (auto& pair : namedArgs) {
        // We marked all the args that we used, so anything left over is an arg assignment
        // for a non-existent arg.
        if (!pair.second.second) {
            auto& diag = context.addDiag(diag::ArgDoesNotExist, pair.second.first->name.location());
            diag << pair.second.first->name.valueText();
            diag << symbol.name;
            bad = true;
        }
    }

    ASTContext bodyContext(*symbolScope, LookupLocation::max);
    bodyContext.assertionInstance = &instance;

    // Propagate previously determined time advance specs and negation operators
    if (context.flags.has(ASTFlags::PropertyTimeAdvance))
        bodyContext.flags |= ASTFlags::PropertyTimeAdvance;
    if (context.flags.has(ASTFlags::PropertyNegation))
        bodyContext.flags |= ASTFlags::PropertyNegation;

    // Let declarations expand directly to an expression.
    if (symbol.kind == SymbolKind::LetDecl)
        return create(comp, *symbol.as<LetDeclSymbol>().exprSyntax, bodyContext);

    // Now instantiate by creating the assertion expression of the sequence / property body.
    auto bodySyntax = symbol.getSyntax();
    SLANG_ASSERT(bodySyntax);

    SmallVector<const Symbol*> localVars;
    auto& body = bindAssertionBody(symbol, *bodySyntax, bodyContext, outputLocalVarArgLoc, instance,
                                   localVars);

    auto result = comp.emplace<AssertionInstanceExpression>(*type, symbol, body,
                                                            /* isRecursiveProperty */ false, range);
    result->arguments = actualArgs.copy(comp);
    result->localVars = localVars.copy(comp);

    if (instance.isRecursive) {
        if (!context.flags.has(ASTFlags::PropertyTimeAdvance))
            context.addDiag(diag::RecursivePropTimeAdvance, range);
        else if (context.flags.has(ASTFlags::PropertyNegation))
            context.addDiag(diag::RecursivePropNegation, range);
    }

    if (bad || body.bad())
        return badExpr(comp, result);

    return *result;
}